

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_writer.cc
# Opt level: O2

bool __thiscall FileWriter::tryWrite(FileWriter *this,string *path)

{
  int iVar1;
  long lVar2;
  int *piVar3;
  string sStack_c8;
  stat st;
  
  lVar2 = std::__cxx11::string::rfind((char)path,0x2f);
  if (lVar2 != -1) {
    std::__cxx11::string::substr((ulong)&sStack_c8,(ulong)path);
    util::mkdirp(&sStack_c8);
    std::__cxx11::string::~string((string *)&sStack_c8);
  }
  iVar1 = stat((path->_M_dataplus)._M_p,(stat *)&st);
  if ((iVar1 < 0) && (piVar3 = __errno_location(), *piVar3 == 2)) {
    return true;
  }
  return this->force_;
}

Assistant:

bool FileWriter::tryWrite(const std::string& path) {
  struct stat st;

  auto rpos = path.rfind('/');
  if (rpos != std::string::npos) {
    mkdirp(path.substr(0, rpos));
  }

  auto rv = stat(path.c_str(), &st);
  if (rv < 0 && errno == ENOENT) {
    return true;
  }

  return force_;
}